

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsVarSerializerWriteValue(JsVarSerializerHandle serializerHandle,JsValueRef rootObject)

{
  anon_class_16_2_4ea5bd80 fn;
  JsValueRef local_20;
  JsValueRef rootObject_local;
  JsVarSerializerHandle serializerHandle_local;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (rootObject == (JsValueRef)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.rootObject = &local_20;
    fn.serializerHandle = &rootObject_local;
    local_20 = rootObject;
    rootObject_local = serializerHandle;
    serializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializerWriteValue::__0>(fn,false,false);
  }
  return serializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializerWriteValue(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_ JsValueRef rootObject)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(rootObject);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        streamWriter->WriteValue(rootObject);
        return JsNoError;
    });
}